

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageBuffer::submit
          (RenderVertexStorageBuffer *this,SubmitContext *context)

{
  VkCommandBuffer pVVar1;
  DeviceInterface *pDVar2;
  pointer pHVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  pVVar1 = context->m_commandBuffer;
  pDVar2 = context->m_context->m_context->m_vkd;
  lVar8 = 0;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,pVVar1,0,
             (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
             object.m_internal);
  uVar4 = 0x10000000;
  lVar5 = 0;
  uVar6 = 0;
  while (pHVar3 = (this->m_descriptorSets).
                  super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)((long)(this->m_descriptorSets).
                              super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar3 >> 3)) {
    uVar6 = uVar6 + 1;
    uVar7 = lVar8 + this->m_bufferSize >> 1 & 0xffffffff;
    if (uVar4 <= this->m_bufferSize) {
      uVar7 = 0x8000000;
    }
    (*pDVar2->_vptr_DeviceInterface[0x56])
              (pDVar2,pVVar1,0,
               (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
               m_data.object.m_internal,0,1,(long)&pHVar3->m_internal + lVar5,0,0);
    (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar1,uVar7,1,0,0);
    lVar5 = lVar5 + 8;
    lVar8 = lVar8 + -0x10000000;
    uVar4 = uVar4 + 0x10000000;
  }
  return;
}

Assistant:

void RenderVertexStorageBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const size_t size	= m_bufferSize < (descriptorSetNdx + 1) * MAX_STORAGE_BUFFER_SIZE
							? (size_t)(m_bufferSize - descriptorSetNdx * MAX_STORAGE_BUFFER_SIZE)
							: (size_t)(MAX_STORAGE_BUFFER_SIZE);

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdDraw(commandBuffer, (deUint32)(size / 2), 1, 0, 0);
	}
}